

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-trace.cpp
# Opt level: O1

void __thiscall dynamicgraph::CustomEntity::testDebugTrace(CustomEntity *this)

{
  ostream *poVar1;
  
  poVar1 = _DAT_0010a2f0;
  if (*(int *)(_DAT_0010a2f0 + *(long *)(*(long *)_DAT_0010a2f0 + -0x18) + 0x20) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (_DAT_0010a2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"testDebugTrace",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(#",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x2d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") :",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# In {",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  poVar1 = _DAT_0010a2f0;
  if (*(int *)(_DAT_0010a2f0 + *(long *)(*(long *)_DAT_0010a2f0 + -0x18) + 0x20) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (_DAT_0010a2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"testDebugTrace",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(#",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") :",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# In/Out { }",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  poVar1 = _DAT_0010a2f0;
  if (*(int *)(_DAT_0010a2f0 + *(long *)(*(long *)_DAT_0010a2f0 + -0x18) + 0x20) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (_DAT_0010a2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"testDebugTrace",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(#",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") :",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Here is a test",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  poVar1 = _DAT_0010a2f0;
  if (*(int *)(_DAT_0010a2f0 + *(long *)(*(long *)_DAT_0010a2f0 + -0x18) + 0x20) != 0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (_DAT_0010a2f0,
             "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"testDebugTrace",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(#",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") :",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# Out }",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void testDebugTrace() {
    /// Test debugging information when entering the code.
    dgDEBUGIN(5);

    /// Intermediate test.
    dgDEBUGINOUT(5);

    dgDEBUG(5) << "Here is a test" << std::endl;

    /// Test debugging information when going out of the code.
    dgDEBUGOUT(5);
  }